

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O3

JsErrorCode JsCreateArray(uint length,JsValueRef *result)

{
  ScriptContext *pSVar1;
  JsrtContext *pJVar2;
  JavascriptArray *pJVar3;
  JsErrorCode JVar4;
  AutoNestedHandledExceptionType local_58 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  undefined1 auStack_38 [8];
  TTDRecorder _actionEntryPopper;
  
  auStack_38 = (undefined1  [8])0x0;
  _actionEntryPopper.m_actionEvent = (EventLogEntry *)0x0;
  pJVar2 = JsrtContext::GetCurrent();
  if (pJVar2 == (JsrtContext *)0x0) {
    JVar4 = JsErrorNoCurrentContext;
  }
  else {
    pSVar1 = (((pJVar2->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (local_58,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
    if (pSVar1->TTDShouldPerformRecordAction == true) {
      TTD::EventLog::RecordJsRTAllocateBasicArray
                (pSVar1->threadContext->TTDLog,(TTDJsRTActionResultAutoRecorder *)auStack_38,length)
      ;
    }
    if (result == (JsValueRef *)0x0) {
      JVar4 = JsErrorNullArgument;
    }
    else {
      *result = (JsValueRef)0x0;
      pJVar3 = Js::JavascriptLibrary::CreateArray
                         ((pSVar1->super_ScriptContextBase).javascriptLibrary,length);
      *result = pJVar3;
      JVar4 = JsNoError;
      if (pSVar1->TTDShouldPerformRecordAction == true) {
        if (_actionEntryPopper.m_actionEvent == (EventLogEntry *)0x0) {
          TTDAbort_unrecoverable_error("Why are we calling this then???");
        }
        *(JavascriptArray **)_actionEntryPopper.m_actionEvent = pJVar3;
        JVar4 = JsNoError;
      }
    }
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_58);
    if (auStack_38 != (undefined1  [8])0x0) {
      if (*(int32 *)((long)auStack_38 + 4) != -1) {
        TTDAbort_unrecoverable_error("Hmm this got changed somewhere???");
      }
      *(JsErrorCode *)((long)auStack_38 + 4) = JVar4;
    }
  }
  return JVar4;
}

Assistant:

CHAKRA_API JsCreateArray(_In_ unsigned int length, _Out_ JsValueRef *result)
{
    return ContextAPINoScriptWrapper([&] (Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTAllocateBasicArray, length);

        PARAM_NOT_NULL(result);
        *result = nullptr;

        *result = scriptContext->GetLibrary()->CreateArray(length);

        PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, result);

        return JsNoError;
    });
}